

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3detectionoutput.cpp
# Opt level: O1

int __thiscall
ncnn::Yolov3DetectionOutput::forward
          (Yolov3DetectionOutput *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
  *this_00;
  undefined4 uVar1;
  int iVar2;
  pointer pMVar3;
  void *pvVar4;
  size_t sVar5;
  size_t sVar6;
  iterator __position;
  Mat *this_01;
  undefined1 auVar7 [12];
  undefined1 auVar8 [12];
  undefined1 auVar9 [16];
  int iVar10;
  Allocator *pAVar11;
  undefined4 *puVar12;
  byte bVar13;
  ulong uVar14;
  BBoxRect *__args;
  ulong uVar15;
  float *pfVar16;
  ulong uVar17;
  Yolov3DetectionOutput *this_02;
  float *pfVar18;
  uint _h;
  ulong uVar19;
  long lVar20;
  pointer piVar21;
  ulong uVar22;
  long lVar23;
  float *pfVar24;
  float fVar25;
  undefined1 auVar26 [12];
  float extraout_XMM0_Db;
  float extraout_XMM0_Db_00;
  undefined1 auVar27 [16];
  float fVar28;
  float fVar29;
  float fVar32;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  float fVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar38;
  float fVar39;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  bbox_rects;
  vector<unsigned_long,_std::allocator<unsigned_long>_> picked;
  vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
  all_bbox_rects;
  undefined1 local_1a8 [8];
  BBoxRect *pBStack_1a0;
  BBoxRect *local_198;
  long local_190;
  BBoxRect local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  _Alloc_hider local_158;
  uint local_14c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  pointer local_138;
  float *local_130;
  float *local_128;
  Yolov3DetectionOutput *local_120;
  float local_118;
  float fStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined1 local_108 [16];
  pointer local_f0;
  pointer local_e8;
  pointer local_e0;
  long local_d8;
  pointer local_d0;
  void *local_c8;
  int *local_c0;
  void *local_b8;
  Allocator *local_b0;
  Allocator *local_a8;
  void *local_a0;
  float *local_98;
  ulong local_90;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined1 local_68 [8];
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [8];
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  local_168._M_allocated_capacity = 0;
  local_168._8_8_ = (void *)0x0;
  local_158._M_p = (pointer)0x0;
  this_02 = this;
  local_f0 = (pointer)top_blobs;
  local_e8 = (pointer)opt;
  if ((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    piVar21 = (pointer)0x0;
    local_120 = this;
    local_e0 = (pointer)bottom_blobs;
    do {
      pMVar3 = local_e0;
      local_1a8 = (undefined1  [8])0x0;
      pBStack_1a0 = (BBoxRect *)0x0;
      local_198 = (BBoxRect *)0x0;
      std::
      vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ::resize((vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                *)local_1a8,(long)this_02->num_box);
      pMVar3 = (((_Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&pMVar3->data)->_M_impl).
               super__Vector_impl_data._M_start;
      iVar10 = pMVar3[(long)piVar21].c / this_02->num_box;
      if (iVar10 != this_02->num_class + 5) {
        std::
        vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
        ::~vector((vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                   *)local_1a8);
        iVar10 = -1;
        goto LAB_004a8ced;
      }
      local_138 = piVar21;
      if (0 < this_02->num_box) {
        local_d0 = pMVar3 + (long)piVar21;
        local_90._0_4_ = local_d0->w;
        local_90._4_4_ = local_d0->h;
        auVar27._8_8_ = 0;
        auVar27._0_8_ = local_90;
        local_68._0_4_ = (float)(int)(undefined4)local_90;
        local_68._4_4_ = (undefined4)(int)local_90._4_4_;
        pvVar4 = (this_02->anchors_scale).data;
        fVar25 = *(float *)((long)pvVar4 + (long)piVar21 * 4);
        auVar35._0_4_ = -(uint)(0 < (int)(undefined4)local_90);
        auVar35._4_4_ = -(uint)(0 < (int)(undefined4)local_90);
        auVar35._8_4_ = -(uint)(0 < (int)local_90._4_4_);
        auVar35._12_4_ = -(uint)(0 < (int)local_90._4_4_);
        local_14c = movmskpd((int)pvVar4,auVar35);
        bVar13 = (byte)local_14c;
        local_88 = (float)(int)(fVar25 * local_68._0_4_);
        fStack_84 = (float)(int)(fVar25 * (float)local_68._4_4_);
        fStack_80 = (float)(int)(fVar25 * 0.0);
        fStack_7c = (float)(int)(fVar25 * 0.0);
        local_d8 = (long)iVar10;
        local_b0 = (Allocator *)(ulong)(uint)local_90._4_4_;
        local_90 = local_90 & 0xffffffff;
        register0x000012c8 = 0x3f0000003f000000;
        auVar27 = rcpps(auVar27,_local_68);
        local_78 = auVar27._0_4_;
        fStack_74 = auVar27._4_4_;
        fStack_70 = auVar27._8_4_;
        fStack_6c = auVar27._12_4_;
        local_78 = (1.0 - local_68._0_4_ * local_78) * local_78 + local_78;
        fStack_74 = (1.0 - (float)local_68._4_4_ * fStack_74) * fStack_74 + fStack_74;
        fStack_70 = (1.0 - fStack_70 * 0.5) * fStack_70 + fStack_70;
        fStack_6c = (1.0 - fStack_6c * 0.5) * fStack_6c + fStack_6c;
        local_c8 = (void *)((long)this_02->num_box * (long)piVar21 * 4);
        local_190 = 0;
        do {
          if (bVar13 >> 1 != 0) {
            lVar23 = local_190 * local_d8;
            uVar22 = local_d0->elemsize;
            local_b8 = (void *)((lVar23 + 5) * local_d0->cstep * uVar22 + (long)local_d0->data);
            local_c0 = (int *)((long)local_d0->w * uVar22);
            uVar19 = (long)local_d0->d * (long)local_d0->h * (long)local_c0 + 0xfU &
                     0xfffffffffffffff0;
            sVar5 = local_d0->cstep;
            pvVar4 = local_d0->data;
            sVar6 = local_d0->elemsize;
            pfVar18 = (float *)((lVar23 + 4) * sVar5 * sVar6 + (long)pvVar4);
            local_128 = (float *)((lVar23 + 3) * sVar5 * sVar6 + (long)pvVar4);
            local_130 = (float *)((lVar23 + 2) * sVar5 * sVar6 + (long)pvVar4);
            pfVar16 = (float *)((lVar23 + 1) * sVar5 * sVar6 + (long)pvVar4);
            pfVar24 = (float *)(lVar23 * sVar5 * sVar6 + (long)pvVar4);
            register0x00001248 =
                 *(undefined8 *)
                  ((long)(this_02->biases).data +
                  (long)((int)*(float *)((long)local_c8 +
                                        (long)(local_190 * 4 + (long)(this_02->mask).data)) * 2) * 4
                  );
            local_58 = 0x3f8000003f800000;
            pAVar11 = (Allocator *)0x0;
            do {
              local_a8 = pAVar11;
              if ((local_14c & 1) != 0) {
                local_48 = (float)(int)pAVar11;
                local_a0 = (void *)((long)local_c0 * (long)pAVar11 + (long)local_b8);
                fStack_40 = local_88;
                fStack_3c = fStack_84;
                uVar15 = 0;
                fStack_44 = local_48;
                do {
                  if ((long)this_02->num_class < 1) {
                    iVar10 = 0;
                    auVar26 = ZEXT812(0xff7fffff);
                  }
                  else {
                    uVar14 = 0;
                    uVar17 = 0;
                    auVar26 = ZEXT812(0xff7fffff);
                    do {
                      fVar25 = *(float *)((long)local_a0 +
                                         (uVar19 - uVar19 % uVar22) * uVar14 + uVar15 * 4);
                      fVar39 = auVar26._0_4_;
                      if (fVar39 < fVar25) {
                        uVar17 = uVar14 & 0xffffffff;
                      }
                      iVar10 = (int)uVar17;
                      if (fVar25 <= fVar39) {
                        fVar25 = fVar39;
                      }
                      auVar26._4_8_ = 0;
                      auVar26._0_4_ = fVar25;
                      uVar14 = uVar14 + 1;
                    } while ((long)this_02->num_class != uVar14);
                  }
                  local_108._12_4_ = 0;
                  local_108._0_12_ = auVar26;
                  local_148._M_allocated_capacity._0_4_ = expf(-*pfVar18);
                  fVar25 = expf(-local_108._0_4_);
                  fVar25 = 1.0 / ((fVar25 + 1.0) * (float)local_148._M_allocated_capacity._0_4_ +
                                 1.0);
                  if (local_120->confidence_threshold <= fVar25) {
                    auVar27 = ZEXT416((uint)*pfVar16);
                    local_118 = -*pfVar24;
                    fStack_114 = -*pfVar16;
                    uStack_110 = 0x80000000;
                    uStack_10c = 0x80000000;
                    local_108._0_4_ = fVar25;
                    local_98 = pfVar18;
                    local_148._M_allocated_capacity._0_4_ = expf(local_118);
                    local_148._M_allocated_capacity._4_4_ = extraout_XMM0_Db;
                    fVar25 = expf(fStack_114);
                    local_148._M_allocated_capacity._0_4_ =
                         (float)local_148._M_allocated_capacity._0_4_ + 1.0;
                    local_148._8_4_ = (float)local_148._M_allocated_capacity._4_4_ + 0.0;
                    local_148._12_4_ = extraout_XMM0_Db_00 + 0.0;
                    local_148._M_allocated_capacity._4_4_ = fVar25 + 1.0;
                    local_118 = expf(*local_130);
                    fVar25 = expf(*local_128);
                    local_188.score = (float)local_108._0_4_;
                    auVar9._4_4_ = local_148._M_allocated_capacity._4_4_;
                    auVar9._0_4_ = local_148._M_allocated_capacity._0_4_;
                    auVar9._8_4_ = local_148._8_4_;
                    auVar9._12_4_ = local_148._12_4_;
                    auVar27 = rcpps(auVar27,auVar9);
                    auVar34._0_4_ = (float)local_58._0_4_ * auVar27._0_4_;
                    auVar34._4_4_ = (float)local_58._4_4_ * auVar27._4_4_;
                    auVar34._8_4_ = fStack_50 * auVar27._8_4_;
                    auVar34._12_4_ = fStack_4c * auVar27._12_4_;
                    fVar28 = ((float)local_58._4_4_ -
                             (float)local_148._M_allocated_capacity._4_4_ * auVar34._4_4_) *
                             auVar27._4_4_ + auVar34._4_4_;
                    auVar7._4_8_ = auVar27._8_8_;
                    auVar7._0_4_ = fStack_44;
                    auVar30._0_8_ = auVar7._0_8_ << 0x20;
                    auVar30._8_4_ = fStack_40;
                    auVar30._12_4_ = fStack_3c;
                    auVar31._4_12_ = auVar30._4_12_;
                    auVar31._0_4_ = (float)(int)uVar15;
                    auVar35 = rcpps(auVar34,auVar31);
                    fVar38 = fVar28 * auVar35._4_4_;
                    local_188.area = local_118 * fStack_50 * auVar35._8_4_;
                    fVar39 = fVar25 * fStack_4c * auVar35._12_4_;
                    local_188.area =
                         (local_118 * fStack_50 - fStack_40 * local_188.area) * auVar35._8_4_ +
                         local_188.area;
                    fVar39 = (fVar25 * fStack_4c - fStack_3c * fVar39) * auVar35._12_4_ + fVar39;
                    fVar25 = (((float)local_58._0_4_ -
                              (float)local_148._M_allocated_capacity._0_4_ * auVar34._0_4_) *
                              auVar27._0_4_ + auVar34._0_4_ + auVar31._0_4_) * local_78;
                    fVar29 = (fVar28 + fStack_44) * fStack_74;
                    fVar32 = local_188.area * fStack_60;
                    fVar33 = fVar39 * fStack_5c;
                    auVar36._4_4_ = fVar33;
                    auVar36._0_4_ = fVar32;
                    auVar36._8_4_ = fVar25;
                    auVar36._12_4_ = fVar29;
                    local_188.xmin = fVar25 - fVar32;
                    local_188.ymin = fVar29 - fVar33;
                    auVar8._4_8_ = auVar36._8_8_;
                    auVar8._0_4_ = fVar33 + ((fVar28 - fStack_44 * fVar38) * auVar35._4_4_ + fVar38)
                                            * (float)local_68._4_4_;
                    auVar37._0_8_ = auVar8._0_8_ << 0x20;
                    auVar37._8_4_ = fVar25 + fVar32;
                    auVar37._12_4_ = fVar29 + fVar33;
                    local_188.area = local_188.area * fVar39;
                    this_00 = (vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                               *)((long)local_1a8 + local_190 * 0x18);
                    __position._M_current = *(BBoxRect **)(this_00 + 8);
                    local_188.xmax = auVar37._8_4_;
                    local_188.ymax = auVar37._12_4_;
                    local_188.label = iVar10;
                    if (__position._M_current == *(BBoxRect **)(this_00 + 0x10)) {
                      std::
                      vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                      ::_M_realloc_insert<ncnn::Yolov3DetectionOutput::BBoxRect_const&>
                                (this_00,__position,&local_188);
                      pfVar18 = local_98;
                    }
                    else {
                      (__position._M_current)->xmax = (float)(int)auVar37._8_8_;
                      (__position._M_current)->ymax = (float)(int)((ulong)auVar37._8_8_ >> 0x20);
                      (__position._M_current)->area = local_188.area;
                      (__position._M_current)->label = iVar10;
                      (__position._M_current)->score = (float)local_108._0_4_;
                      (__position._M_current)->xmin = local_188.xmin;
                      (__position._M_current)->ymin = local_188.ymin;
                      (__position._M_current)->xmax = auVar37._8_4_;
                      *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 0x1c;
                      pfVar18 = local_98;
                    }
                  }
                  pfVar24 = pfVar24 + 1;
                  pfVar16 = pfVar16 + 1;
                  local_130 = local_130 + 1;
                  local_128 = local_128 + 1;
                  pfVar18 = pfVar18 + 1;
                  uVar15 = uVar15 + 1;
                  this_02 = local_120;
                } while (uVar15 != local_90);
              }
              pAVar11 = (Allocator *)((long)&local_a8->_vptr_Allocator + 1);
            } while (pAVar11 != local_b0);
          }
          local_190 = local_190 + 1;
        } while (local_190 < this_02->num_box);
      }
      this = (Yolov3DetectionOutput *)local_1a8;
      if (0 < this_02->num_box) {
        lVar23 = 8;
        lVar20 = 0;
        do {
          std::
          vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
          ::
          _M_range_insert<__gnu_cxx::__normal_iterator<ncnn::Yolov3DetectionOutput::BBoxRect_const*,std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>>>
                    ((vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                      *)&local_168,local_168._8_8_,*(undefined8 *)((long)local_1a8 + lVar23 + -8),
                     *(undefined8 *)
                      ((long)&(((_Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                                 *)local_1a8)->_M_impl).super__Vector_impl_data._M_start + lVar23));
          lVar20 = lVar20 + 1;
          lVar23 = lVar23 + 0x18;
        } while (lVar20 < this_02->num_box);
      }
      std::
      vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
      ::~vector((vector<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>,_std::allocator<std::vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>_>_>
                 *)this);
      piVar21 = (pointer)((long)local_138 + 1);
    } while (piVar21 < (pointer)(((long)local_e0->refcount -
                                  (long)(((_Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)
                                         &local_e0->data)->_M_impl).super__Vector_impl_data._M_start
                                 >> 3) * -0x71c71c71c71c71c7));
  }
  if (local_168._M_allocated_capacity != local_168._8_8_) {
    this = this_02;
    qsort_descent_inplace
              (this_02,(vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                        *)&local_168,0,
               (int)((ulong)(local_168._8_8_ - local_168._0_8_) >> 2) * -0x49249249 + -1);
  }
  local_188.score = 0.0;
  local_188.xmin = 0.0;
  local_188.ymin = 0.0;
  local_188.xmax = 0.0;
  local_188.ymax = 0.0;
  local_188.area = 0.0;
  nms_sorted_bboxes(this,(vector<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                          *)&local_168,
                    (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_188,
                    this_02->nms_threshold);
  local_1a8 = (undefined1  [8])0x0;
  pBStack_1a0 = (BBoxRect *)0x0;
  local_198 = (BBoxRect *)0x0;
  lVar23 = CONCAT44(local_188.xmin,local_188.score);
  if (CONCAT44(local_188.xmax,local_188.ymin) != lVar23) {
    uVar22 = 0;
    do {
      __args = (BBoxRect *)(*(long *)(lVar23 + uVar22 * 8) * 0x1c + local_168._M_allocated_capacity)
      ;
      if (pBStack_1a0 == local_198) {
        std::
        vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
        ::_M_realloc_insert<ncnn::Yolov3DetectionOutput::BBoxRect_const&>
                  ((vector<ncnn::Yolov3DetectionOutput::BBoxRect,std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>>
                    *)local_1a8,(iterator)pBStack_1a0,__args);
      }
      else {
        fVar28 = __args->score;
        fVar29 = __args->xmin;
        fVar32 = __args->ymin;
        fVar33 = __args->xmax;
        fVar25 = __args->ymax;
        fVar39 = __args->area;
        iVar10 = __args->label;
        pBStack_1a0->xmax = __args->xmax;
        pBStack_1a0->ymax = fVar25;
        pBStack_1a0->area = fVar39;
        pBStack_1a0->label = iVar10;
        pBStack_1a0->score = fVar28;
        pBStack_1a0->xmin = fVar29;
        pBStack_1a0->ymin = fVar32;
        pBStack_1a0->xmax = fVar33;
        pBStack_1a0 = pBStack_1a0 + 1;
      }
      uVar22 = uVar22 + 1;
      lVar23 = CONCAT44(local_188.xmin,local_188.score);
    } while (uVar22 < (ulong)(CONCAT44(local_188.xmax,local_188.ymin) - lVar23 >> 3));
  }
  _h = (int)((long)pBStack_1a0 - (long)local_1a8 >> 2) * -0x49249249;
  iVar10 = 0;
  if (_h != 0) {
    this_01 = (((_Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)&local_f0->data)->_M_impl).
              super__Vector_impl_data._M_start;
    Mat::create(this_01,6,_h,4,(Allocator *)local_e8->refcount);
    iVar10 = -100;
    if (((this_01->data != (void *)0x0) && ((long)this_01->c * this_01->cstep != 0)) &&
       (iVar10 = 0, 0 < (int)_h)) {
      iVar2 = this_01->w;
      sVar5 = this_01->elemsize;
      puVar12 = (undefined4 *)((long)this_01->data + 0x14);
      iVar10 = 0;
      lVar23 = 0;
      do {
        uVar1 = *(undefined4 *)
                 ((long)&(((_Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                            *)local_1a8)->_M_impl).super__Vector_impl_data._M_start + lVar23);
        puVar12[-5] = (float)(*(int *)((long)&(((pointer)((long)local_1a8 + 0x18))->
                                              super__Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                                              )._M_impl.super__Vector_impl_data._M_start + lVar23) +
                             1);
        puVar12[-4] = uVar1;
        puVar12[-3] = *(undefined4 *)
                       ((long)&(((_Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                                  *)local_1a8)->_M_impl).super__Vector_impl_data._M_start +
                       lVar23 + 4);
        puVar12[-2] = *(undefined4 *)
                       ((long)&(((_Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                                  *)local_1a8)->_M_impl).super__Vector_impl_data._M_finish + lVar23)
        ;
        puVar12[-1] = *(undefined4 *)
                       ((long)&(((_Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                                  *)local_1a8)->_M_impl).super__Vector_impl_data._M_finish +
                       lVar23 + 4);
        *puVar12 = *(undefined4 *)
                    ((long)&(((_Vector_base<ncnn::Yolov3DetectionOutput::BBoxRect,_std::allocator<ncnn::Yolov3DetectionOutput::BBoxRect>_>
                               *)local_1a8)->_M_impl).super__Vector_impl_data._M_end_of_storage +
                    lVar23);
        lVar23 = lVar23 + 0x1c;
        puVar12 = (undefined4 *)((long)puVar12 + (long)iVar2 * sVar5);
      } while ((ulong)(_h & 0x7fffffff) * 0x1c != lVar23);
    }
  }
  if (local_1a8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1a8,(long)local_198 - (long)local_1a8);
  }
  pvVar4 = (void *)CONCAT44(local_188.xmin,local_188.score);
  if (pvVar4 != (void *)0x0) {
    operator_delete(pvVar4,CONCAT44(local_188.area,local_188.ymax) - (long)pvVar4);
  }
LAB_004a8ced:
  if ((void *)local_168._M_allocated_capacity != (void *)0x0) {
    operator_delete((void *)local_168._M_allocated_capacity,(long)local_158._M_p - local_168._0_8_);
  }
  return iVar10;
}

Assistant:

int Yolov3DetectionOutput::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    // gather all box
    std::vector<BBoxRect> all_bbox_rects;

    for (size_t b = 0; b < bottom_blobs.size(); b++)
    {
        std::vector<std::vector<BBoxRect> > all_box_bbox_rects;
        all_box_bbox_rects.resize(num_box);
        const Mat& bottom_top_blobs = bottom_blobs[b];

        int w = bottom_top_blobs.w;
        int h = bottom_top_blobs.h;
        int channels = bottom_top_blobs.c;
        //printf("%d %d %d\n", w, h, channels);
        const int channels_per_box = channels / num_box;

        // anchor coord + box score + num_class
        if (channels_per_box != 4 + 1 + num_class)
            return -1;
        size_t mask_offset = b * num_box;
        int net_w = (int)(anchors_scale[b] * w);
        int net_h = (int)(anchors_scale[b] * h);
        //printf("%d %d\n", net_w, net_h);

        //printf("%d %d %d\n", w, h, channels);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int pp = 0; pp < num_box; pp++)
        {
            int p = pp * channels_per_box;
            int biases_index = static_cast<int>(mask[pp + mask_offset]);
            //printf("%d\n", biases_index);
            const float bias_w = biases[biases_index * 2];
            const float bias_h = biases[biases_index * 2 + 1];
            //printf("%f %f\n", bias_w, bias_h);
            const float* xptr = bottom_top_blobs.channel(p);
            const float* yptr = bottom_top_blobs.channel(p + 1);
            const float* wptr = bottom_top_blobs.channel(p + 2);
            const float* hptr = bottom_top_blobs.channel(p + 3);

            const float* box_score_ptr = bottom_top_blobs.channel(p + 4);

            // softmax class scores
            Mat scores = bottom_top_blobs.channel_range(p + 5, num_class);
            //softmax->forward_inplace(scores, opt);

            for (int i = 0; i < h; i++)
            {
                for (int j = 0; j < w; j++)
                {
                    // find class index with max class score
                    int class_index = 0;
                    float class_score = -FLT_MAX;
                    for (int q = 0; q < num_class; q++)
                    {
                        float score = scores.channel(q).row(i)[j];
                        if (score > class_score)
                        {
                            class_index = q;
                            class_score = score;
                        }
                    }

                    //sigmoid(box_score) * sigmoid(class_score)
                    float confidence = 1.f / ((1.f + exp(-box_score_ptr[0]) * (1.f + exp(-class_score))));
                    if (confidence >= confidence_threshold)
                    {
                        // region box
                        float bbox_cx = (j + sigmoid(xptr[0])) / w;
                        float bbox_cy = (i + sigmoid(yptr[0])) / h;
                        float bbox_w = static_cast<float>(exp(wptr[0]) * bias_w / net_w);
                        float bbox_h = static_cast<float>(exp(hptr[0]) * bias_h / net_h);

                        float bbox_xmin = bbox_cx - bbox_w * 0.5f;
                        float bbox_ymin = bbox_cy - bbox_h * 0.5f;
                        float bbox_xmax = bbox_cx + bbox_w * 0.5f;
                        float bbox_ymax = bbox_cy + bbox_h * 0.5f;

                        float area = bbox_w * bbox_h;

                        BBoxRect c = {confidence, bbox_xmin, bbox_ymin, bbox_xmax, bbox_ymax, area, class_index};
                        all_box_bbox_rects[pp].push_back(c);
                    }

                    xptr++;
                    yptr++;
                    wptr++;
                    hptr++;

                    box_score_ptr++;
                }
            }
        }

        for (int i = 0; i < num_box; i++)
        {
            const std::vector<BBoxRect>& box_bbox_rects = all_box_bbox_rects[i];

            all_bbox_rects.insert(all_bbox_rects.end(), box_bbox_rects.begin(), box_bbox_rects.end());
        }
    }

    // global sort inplace
    qsort_descent_inplace(all_bbox_rects);

    // apply nms
    std::vector<size_t> picked;
    nms_sorted_bboxes(all_bbox_rects, picked, nms_threshold);

    // select
    std::vector<BBoxRect> bbox_rects;

    for (size_t i = 0; i < picked.size(); i++)
    {
        size_t z = picked[i];
        bbox_rects.push_back(all_bbox_rects[z]);
    }

    // fill result
    int num_detected = static_cast<int>(bbox_rects.size());
    if (num_detected == 0)
        return 0;

    Mat& top_blob = top_blobs[0];
    top_blob.create(6, num_detected, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    for (int i = 0; i < num_detected; i++)
    {
        const BBoxRect& r = bbox_rects[i];
        float score = r.score;
        float* outptr = top_blob.row(i);

        outptr[0] = static_cast<float>(r.label + 1); // +1 for prepend background class
        outptr[1] = score;
        outptr[2] = r.xmin;
        outptr[3] = r.ymin;
        outptr[4] = r.xmax;
        outptr[5] = r.ymax;
    }

    return 0;
}